

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

Maybe<long_long> __thiscall
kj::anon_unknown_55::tryParseSigned(anon_unknown_55 *this,StringPtr *s,longlong min,longlong max)

{
  char *s_00;
  int __base;
  bool bVar1;
  int *piVar2;
  longlong lVar3;
  anon_union_8_1_a8c68091_for_NullableValue<long_long>_2 aVar4;
  Maybe<long_long> MVar5;
  char *endPtr;
  
  aVar4.value = min;
  if (1 < (s->content).size_) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    s_00 = (s->content).ptr;
    bVar1 = isHex(s_00);
    __base = 10;
    if (bVar1) {
      __base = 0x10;
    }
    lVar3 = strtoll(s_00,&endPtr,__base);
    aVar4 = (anon_union_8_1_a8c68091_for_NullableValue<long_long>_2)(s->content).size_;
    if (((endPtr == (s->content).ptr + (aVar4.value - 1)) && (*piVar2 != 0x22)) &&
       (aVar4._1_7_ = (undefined7)((ulong)aVar4 >> 8), aVar4.value._0_1_ = lVar3 <= max,
       min <= lVar3 && lVar3 <= max)) {
      *this = (anon_unknown_55)0x1;
      *(longlong *)(this + 8) = lVar3;
      goto LAB_001c49cb;
    }
  }
  *this = (anon_unknown_55)0x0;
LAB_001c49cb:
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<long_long>)MVar5.ptr;
}

Assistant:

Maybe<long long> tryParseSigned(const StringPtr& s, long long min, long long max) {
  if (s == nullptr) { return kj::none; } // String does not contain valid number.
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  if (endPtr != s.end() || errno == ERANGE || value < min || max < value) {
    return kj::none;
  }
  return value;
}